

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O3

LY_ERR xml_print_data(ly_out *out,lyd_node *root,uint32_t options)

{
  LY_ERR LVar1;
  lys_module *plVar2;
  xmlpr_ctx local_68;
  
  local_68.prefix.field_2.dnodes = (lyd_node **)0x0;
  local_68.ns.size = 0;
  local_68.ns.count = 0;
  local_68.ctx = (ly_ctx *)0x0;
  local_68.prefix.size = 0;
  local_68.prefix.count = 0;
  local_68.out = (ly_out *)0x0;
  local_68.level = 0;
  local_68._10_2_ = 0;
  local_68.options = 0;
  local_68.ns.field_2.dnodes = (lyd_node **)0x0;
  if (root == (lyd_node *)0x0) {
    if ((out->type & ~LY_OUT_FDSTREAM) == LY_OUT_MEMORY) {
      ly_print_(out,"");
    }
  }
  else {
    local_68._8_8_ = (ulong)options << 0x20;
    if (root->schema == (lysc_node *)0x0) {
      plVar2 = (lys_module *)&root[2].schema;
    }
    else {
      plVar2 = root->schema->module;
    }
    local_68.ctx = plVar2->ctx;
    local_68.out = out;
    do {
      LVar1 = xml_print_node(&local_68,root);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
    } while (((options & 1) != 0) && (root = root->next, root != (lyd_node *)0x0));
    if (local_68.ns.count != 0 || local_68.prefix.count != 0) {
      __assert_fail("!pctx.prefix.count && !pctx.ns.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_xml.c"
                    ,0x271,
                    "LY_ERR xml_print_data(struct ly_out *, const struct lyd_node *, uint32_t)");
    }
  }
  ly_set_erase(&local_68.prefix,(_func_void_void_ptr *)0x0);
  ly_set_erase(&local_68.ns,(_func_void_void_ptr *)0x0);
  ly_print_flush(out);
  return LY_SUCCESS;
}

Assistant:

LY_ERR
xml_print_data(struct ly_out *out, const struct lyd_node *root, uint32_t options)
{
    const struct lyd_node *node;
    struct xmlpr_ctx pctx = {0};

    if (!root) {
        if ((out->type == LY_OUT_MEMORY) || (out->type == LY_OUT_CALLBACK)) {
            ly_print_(out, "");
        }
        goto finish;
    }

    pctx.out = out;
    pctx.level = 0;
    pctx.options = options;
    pctx.ctx = LYD_CTX(root);

    /* content */
    LY_LIST_FOR(root, node) {
        LY_CHECK_RET(xml_print_node(&pctx, node));
        if (!(options & LYD_PRINT_WITHSIBLINGS)) {
            break;
        }
    }

finish:
    assert(!pctx.prefix.count && !pctx.ns.count);
    ly_set_erase(&pctx.prefix, NULL);
    ly_set_erase(&pctx.ns, NULL);
    ly_print_flush(out);
    return LY_SUCCESS;
}